

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O2

void __thiscall nigel::IMC_Generator::printAssembly(IMC_Generator *this,CodeBase *base)

{
  HexOp HVar1;
  bool bVar2;
  IMC_Generator *pIVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var4;
  double dVar5;
  double extraout_XMM0_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  String out;
  string local_358;
  shared_ptr<nigel::IM_Command> c;
  String tabs;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_300;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2e0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2c0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2b0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_2a0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_290;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_280;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_260;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_250;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_240;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_230;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_220;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> local_a0;
  String local_90;
  String local_70;
  String local_50;
  
  dVar5 = (double)std::__cxx11::string::string((string *)&tabs,"__ASM__",(allocator *)&out);
  helper::log((helper *)&tabs,dVar5);
  std::__cxx11::string::~string((string *)&tabs);
  std::__cxx11::string::string((string *)&tabs,"",(allocator *)&out);
  p_Var4 = (_List_node_base *)&base->imCommands;
  do {
    p_Var4 = (((_List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&base->imCommands) {
      dVar5 = (double)std::__cxx11::string::string((string *)&out,"__END__",(allocator *)&local_398)
      ;
      helper::log((helper *)&out,dVar5);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&tabs);
      return;
    }
    std::__shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 1));
    dVar5 = (double)std::__cxx11::string::string((string *)&out,(string *)&tabs);
    switch((c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type) {
    case operation:
      HVar1 = (c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              operation;
      switch(HVar1) {
      case mov_a_const:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a0,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3)
        ;
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_a0);
        std::operator+(&local_398,"MOV A, ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_a0._M_refcount;
        break;
      case mov_adr_const:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c0,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3)
        ;
        operatorToString_abi_cxx11_(&local_70,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_c0);
        std::operator+(&local_358,"MOV ",&local_70);
        std::operator+(&bStack_3b8,&local_358,", ");
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op2;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_d0,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3)
        ;
        operatorToString_abi_cxx11_(&local_90,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_d0);
        std::operator+(&local_398,&bStack_3b8,&local_90);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = &local_c0._M_refcount;
        break;
      case mov_atr0_const:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_170,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_170)
        ;
        std::operator+(&local_398,"MOV @R0, ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_170._M_refcount;
        break;
      case 0x77:
      case mov_r0_const|jmp_abs:
      case mov_r0_const|rr_a:
      case mov_r0_const|inc_a:
      case 0x7d:
      case mov_r0_const|inc_a|jmp_abs:
      case mov_r0_const|inc_a|rr_a:
      case 0x81:
      case jmp_rel|jmp_abs:
      case jmp_rel|rr_a:
      case 0x87:
      case 0x89:
      case mov_adr_r0|jmp_abs:
      case mov_adr_r0|rr_a:
      case mov_adr_r0|inc_a:
      case 0x8d:
      case mov_adr_r0|inc_a|jmp_abs:
      case mov_adr_r0|inc_a|rr_a:
      case 0x91:
      case mov_dptr_const|jmp_abs:
      case mov_dptr_const|rr_a:
      case 0x97:
switchD_0015d454_caseD_a5:
        if (HVar1 == call_abs) {
          pIVar3 = (IMC_Generator *)
                   &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    op1;
          std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_300,
                     (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
          operatorToString_abi_cxx11_
                    (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_300);
          std::operator+(&local_398,"LCALL ",&bStack_3b8);
          std::__cxx11::string::append((string *)&out);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&bStack_3b8);
          this_00 = &local_300._M_refcount;
        }
        else {
          if ((HVar1 == ret) || (HVar1 == reti)) goto switchD_0015d6e4_caseD_e4;
          if (HVar1 != jmp_nz_rel) goto switchD_0015d3cf_default;
          pIVar3 = (IMC_Generator *)
                   &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    op1;
          std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_2f0,
                     (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
          operatorToString_abi_cxx11_
                    (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_2f0);
          std::operator+(&local_398,"JNZ ",&bStack_3b8);
          std::__cxx11::string::append((string *)&out);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&bStack_3b8);
          this_00 = &local_2f0._M_refcount;
        }
        break;
      case mov_r0_const:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_130,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_130)
        ;
        std::operator+(&local_398,"MOV R0, ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_130._M_refcount;
        break;
      case mov_r1_const:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_150,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_150)
        ;
        std::operator+(&local_398,"MOV R1, ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_150._M_refcount;
        break;
      case jmp_rel:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_2b0,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_2b0)
        ;
        std::operator+(&local_398,"SJMP ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_2b0._M_refcount;
        break;
      case div_a_b:
        goto switchD_0015d6e4_caseD_e4;
      case mov_adr_adr:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_110,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&local_90,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_110);
        std::operator+(&local_70,"MOV ",&local_90);
        std::operator+(&local_358,&local_70,", ");
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op2;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_120,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&local_50,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_120);
        std::operator+(&bStack_3b8,&local_358,&local_50);
        std::operator+(&local_398,&bStack_3b8," ; r into l");
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        this_00 = &local_110._M_refcount;
        break;
      case mov_adr_atr0:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_100,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&local_358,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_100);
        std::operator+(&bStack_3b8,"MOV ",&local_358);
        std::operator+(&local_398,&bStack_3b8,", @R0");
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        std::__cxx11::string::~string((string *)&local_358);
        this_00 = &local_100._M_refcount;
        break;
      case mov_adr_r0:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_f0,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3)
        ;
        operatorToString_abi_cxx11_(&local_358,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_f0);
        std::operator+(&bStack_3b8,"MOV ",&local_358);
        std::operator+(&local_398,&bStack_3b8,", R0");
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        std::__cxx11::string::~string((string *)&local_358);
        this_00 = &local_f0._M_refcount;
        break;
      case mov_dptr_const:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_190,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_190)
        ;
        std::operator+(&local_398,"MOV DPTR, ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_190._M_refcount;
        break;
      case sub_a_const:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_1f0,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_1f0)
        ;
        std::operator+(&local_398,"SUBB A, ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_1f0._M_refcount;
        break;
      case sub_a_adr:
        pIVar3 = (IMC_Generator *)
                 &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->op1;
        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_200,(__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3
                  );
        operatorToString_abi_cxx11_(&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_200)
        ;
        std::operator+(&local_398,"SUBB A, ",&bStack_3b8);
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&bStack_3b8);
        this_00 = &local_200._M_refcount;
        break;
      case sub_a_atr0:
        goto switchD_0015d6e4_caseD_e4;
      case sub_a_r0:
        goto switchD_0015d6e4_caseD_e4;
      default:
        switch(HVar1) {
        case movx_a_dptr:
          break;
        case 0xe1:
        case movx_a_dptr|jmp_abs:
        case movx_a_dptr|rr_a:
        case 0xe9:
        case mov_a_r0|jmp_abs:
        case mov_a_r0|rr_a:
        case mov_a_r0|inc_a:
        case 0xed:
        case mov_a_r0|inc_a|jmp_abs:
        case mov_a_r0|inc_a|rr_a:
        case 0xf1:
        case movx_dptr_a|jmp_abs:
        case movx_dptr_a|rr_a:
          goto switchD_0015d454_caseD_a5;
        case clr_a:
          break;
        case mov_a_adr:
          pIVar3 = (IMC_Generator *)
                   &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    op1;
          std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_b0,
                     (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
          operatorToString_abi_cxx11_
                    (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_b0);
          std::operator+(&local_398,"MOV A, ",&bStack_3b8);
          std::__cxx11::string::append((string *)&out);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&bStack_3b8);
          this_00 = &local_b0._M_refcount;
          goto LAB_0015e8a2;
        case mov_a_atr0:
          break;
        case mov_a_atr1:
          break;
        case mov_a_r0:
          break;
        case movx_dptr_a:
          break;
        case cpl_a:
          break;
        case mov_adr_a:
          pIVar3 = (IMC_Generator *)
                   &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    op1;
          std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_e0,
                     (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
          operatorToString_abi_cxx11_(&local_358,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_e0)
          ;
          std::operator+(&bStack_3b8,"MOV ",&local_358);
          std::operator+(&local_398,&bStack_3b8,", A");
          std::__cxx11::string::append((string *)&out);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&bStack_3b8);
          std::__cxx11::string::~string((string *)&local_358);
          this_00 = &local_e0._M_refcount;
          goto LAB_0015e8a2;
        case mov_atr0_a:
          break;
        case mov_atr1_a:
          break;
        case mov_r0_a:
          break;
        case mov_r1_a:
          break;
        default:
          switch(HVar1) {
          case push_adr:
            pIVar3 = (IMC_Generator *)
                     &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      op1;
            std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_1a0,
                       (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
            operatorToString_abi_cxx11_
                      (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_1a0);
            std::operator+(&local_398,"PUSH ",&bStack_3b8);
            std::__cxx11::string::append((string *)&out);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&bStack_3b8);
            this_00 = &local_1a0._M_refcount;
            break;
          case 0xc1:
          case push_adr|inc_a:
          case push_adr|inc_a|jmp_abs:
          case push_adr|inc_a|rr_a:
          case xch_a_r0|jmp_abs:
          case xch_a_r0|rr_a:
          case xch_a_r0|inc_a:
          case 0xcd:
          case xch_a_r0|inc_a|jmp_abs:
          case xch_a_r0|inc_a|rr_a:
          case 0xd1:
            goto switchD_0015d454_caseD_a5;
          case clr_bit:
            pIVar3 = (IMC_Generator *)
                     &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      op1;
            std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_280,
                       (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
            operatorToString_abi_cxx11_
                      (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_280);
            std::operator+(&local_398,"CLR ",&bStack_3b8);
            std::__cxx11::string::append((string *)&out);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&bStack_3b8);
            this_00 = &local_280._M_refcount;
            break;
          case clr_c:
            goto switchD_0015d6e4_caseD_e4;
          case xch_a_adr:
            pIVar3 = (IMC_Generator *)
                     &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      op1;
            std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_1c0,
                       (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
            operatorToString_abi_cxx11_
                      (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_1c0);
            std::operator+(&local_398,"XCH A, ",&bStack_3b8);
            std::__cxx11::string::append((string *)&out);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&bStack_3b8);
            this_00 = &local_1c0._M_refcount;
            break;
          case xch_a_r0:
            goto switchD_0015d6e4_caseD_e4;
          case xch_a_r1:
            goto switchD_0015d6e4_caseD_e4;
          case pop_adr:
            pIVar3 = (IMC_Generator *)
                     &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      op1;
            std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_1b0,
                       (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
            operatorToString_abi_cxx11_
                      (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_1b0);
            std::operator+(&local_398,"POP ",&bStack_3b8);
            std::__cxx11::string::append((string *)&out);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&bStack_3b8);
            this_00 = &local_1b0._M_refcount;
            break;
          case set_bit:
            pIVar3 = (IMC_Generator *)
                     &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      op1;
            std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_290,
                       (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
            operatorToString_abi_cxx11_
                      (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_290);
            std::operator+(&local_398,"SETB ",&bStack_3b8);
            std::__cxx11::string::append((string *)&out);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&bStack_3b8);
            this_00 = &local_290._M_refcount;
            break;
          default:
            switch(HVar1) {
            case rl_a:
              break;
            case add_a_const:
              pIVar3 = (IMC_Generator *)
                       &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->op1;
              std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_1d0,
                         (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
              operatorToString_abi_cxx11_
                        (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_1d0);
              std::operator+(&local_398,"ADD A, ",&bStack_3b8);
              std::__cxx11::string::append((string *)&out);
              std::__cxx11::string::~string((string *)&local_398);
              std::__cxx11::string::~string((string *)&bStack_3b8);
              this_00 = &local_1d0._M_refcount;
              goto LAB_0015e8a2;
            case add_a_adr:
              pIVar3 = (IMC_Generator *)
                       &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->op1;
              std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_1e0,
                         (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
              operatorToString_abi_cxx11_
                        (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_1e0);
              std::operator+(&local_398,"ADD A, ",&bStack_3b8);
              std::__cxx11::string::append((string *)&out);
              std::__cxx11::string::~string((string *)&local_398);
              std::__cxx11::string::~string((string *)&bStack_3b8);
              this_00 = &local_1e0._M_refcount;
              goto LAB_0015e8a2;
            case add_a_atr0:
              break;
            case 0x27:
              goto switchD_0015d454_caseD_a5;
            case add_a_r0:
              break;
            default:
              switch(HVar1) {
              case nop:
                break;
              case 1:
                goto switchD_0015d454_caseD_a5;
              case jmp_abs:
                pIVar3 = (IMC_Generator *)
                         &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->op1;
                std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_2a0,
                           (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3);
                operatorToString_abi_cxx11_
                          (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_2a0);
                std::operator+(&local_398,"LJMP ",&bStack_3b8);
                std::__cxx11::string::append((string *)&out);
                std::__cxx11::string::~string((string *)&local_398);
                std::__cxx11::string::~string((string *)&bStack_3b8);
                this_00 = &local_2a0._M_refcount;
                goto LAB_0015e8a2;
              case rr_a:
                break;
              case inc_a:
                break;
              default:
                switch(HVar1) {
                case jmp_c_rel:
                  pIVar3 = (IMC_Generator *)
                           &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->op1;
                  std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_2c0,
                             (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3)
                  ;
                  operatorToString_abi_cxx11_
                            (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_2c0);
                  std::operator+(&local_398,"JC ",&bStack_3b8);
                  std::__cxx11::string::append((string *)&out);
                  std::__cxx11::string::~string((string *)&local_398);
                  std::__cxx11::string::~string((string *)&bStack_3b8);
                  this_00 = &local_2c0._M_refcount;
                  break;
                case 0x41:
                case jmp_c_rel|jmp_abs:
                case jmp_c_rel|rr_a:
                  goto switchD_0015d454_caseD_a5;
                case or_a_const:
                  pIVar3 = (IMC_Generator *)
                           &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->op1;
                  std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_230,
                             (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3)
                  ;
                  operatorToString_abi_cxx11_
                            (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_230);
                  std::operator+(&local_398,"ORL A, ",&bStack_3b8);
                  std::__cxx11::string::append((string *)&out);
                  std::__cxx11::string::~string((string *)&local_398);
                  std::__cxx11::string::~string((string *)&bStack_3b8);
                  this_00 = &local_230._M_refcount;
                  break;
                case or_a_adr:
                  pIVar3 = (IMC_Generator *)
                           &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->op1;
                  std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_240,
                             (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)pIVar3)
                  ;
                  operatorToString_abi_cxx11_
                            (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_240);
                  std::operator+(&local_398,"ORL A, ",&bStack_3b8);
                  std::__cxx11::string::append((string *)&out);
                  std::__cxx11::string::~string((string *)&local_398);
                  std::__cxx11::string::~string((string *)&bStack_3b8);
                  this_00 = &local_240._M_refcount;
                  break;
                case or_a_atr0:
                  goto switchD_0015d6e4_caseD_e4;
                default:
                  switch(HVar1) {
                  case jmp_nc_rel:
                    pIVar3 = (IMC_Generator *)
                             &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->op1;
                    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              (&local_2d0,
                               (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                               pIVar3);
                    operatorToString_abi_cxx11_
                              (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_2d0);
                    std::operator+(&local_398,"JNC ",&bStack_3b8);
                    std::__cxx11::string::append((string *)&out);
                    std::__cxx11::string::~string((string *)&local_398);
                    std::__cxx11::string::~string((string *)&bStack_3b8);
                    this_00 = &local_2d0._M_refcount;
                    break;
                  case 0x51:
                  case jmp_nc_rel|jmp_abs:
                  case jmp_nc_rel|rr_a:
                    goto switchD_0015d454_caseD_a5;
                  case and_a_const:
                    pIVar3 = (IMC_Generator *)
                             &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->op1;
                    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              (&local_210,
                               (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                               pIVar3);
                    operatorToString_abi_cxx11_
                              (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_210);
                    std::operator+(&local_398,"ANL A, #",&bStack_3b8);
                    std::__cxx11::string::append((string *)&out);
                    std::__cxx11::string::~string((string *)&local_398);
                    std::__cxx11::string::~string((string *)&bStack_3b8);
                    this_00 = &local_210._M_refcount;
                    break;
                  case and_a_adr:
                    pIVar3 = (IMC_Generator *)
                             &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->op1;
                    std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              (&local_220,
                               (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                               pIVar3);
                    operatorToString_abi_cxx11_
                              (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_220);
                    std::operator+(&local_398,"ANL A, ",&bStack_3b8);
                    std::__cxx11::string::append((string *)&out);
                    std::__cxx11::string::~string((string *)&local_398);
                    std::__cxx11::string::~string((string *)&bStack_3b8);
                    this_00 = &local_220._M_refcount;
                    break;
                  case and_a_atr0:
                    goto switchD_0015d6e4_caseD_e4;
                  default:
                    switch(HVar1) {
                    case jmp_z_rel:
                      pIVar3 = (IMC_Generator *)
                               &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->op1;
                      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_2e0,
                                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                                   pIVar3);
                      operatorToString_abi_cxx11_
                                (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_2e0);
                      std::operator+(&local_398,"JZ ",&bStack_3b8);
                      std::__cxx11::string::append((string *)&out);
                      std::__cxx11::string::~string((string *)&local_398);
                      std::__cxx11::string::~string((string *)&bStack_3b8);
                      this_00 = &local_2e0._M_refcount;
                      break;
                    case 0x61:
                    case jmp_z_rel|jmp_abs:
                    case jmp_z_rel|rr_a:
                      goto switchD_0015d454_caseD_a5;
                    case xor_a_const:
                      pIVar3 = (IMC_Generator *)
                               &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->op1;
                      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_250,
                                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                                   pIVar3);
                      operatorToString_abi_cxx11_
                                (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_250);
                      std::operator+(&local_398,"XRL A, ",&bStack_3b8);
                      std::__cxx11::string::append((string *)&out);
                      std::__cxx11::string::~string((string *)&local_398);
                      std::__cxx11::string::~string((string *)&bStack_3b8);
                      this_00 = &local_250._M_refcount;
                      break;
                    case xor_a_adr:
                      pIVar3 = (IMC_Generator *)
                               &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->op1;
                      std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_260,
                                   (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *)
                                   pIVar3);
                      operatorToString_abi_cxx11_
                                (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_260);
                      std::operator+(&local_398,"XRL A, ",&bStack_3b8);
                      std::__cxx11::string::append((string *)&out);
                      std::__cxx11::string::~string((string *)&local_398);
                      std::__cxx11::string::~string((string *)&bStack_3b8);
                      this_00 = &local_260._M_refcount;
                      break;
                    case xor_a_atr0:
                      goto switchD_0015d6e4_caseD_e4;
                    default:
                      switch(HVar1) {
                      case mul_a_b:
                        goto switchD_0015d6e4_caseD_e4;
                      case 0xa5:
                      case 0xa7:
                        goto switchD_0015d454_caseD_a5;
                      case mov_atr0_adr:
                        pIVar3 = (IMC_Generator *)
                                 &(c.
                                   super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->op1;
                        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_180,
                                     (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *
                                     )pIVar3);
                        operatorToString_abi_cxx11_
                                  (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_180);
                        std::operator+(&local_398,"MOV @R0, ",&bStack_3b8);
                        std::__cxx11::string::append((string *)&out);
                        std::__cxx11::string::~string((string *)&local_398);
                        std::__cxx11::string::~string((string *)&bStack_3b8);
                        this_00 = &local_180._M_refcount;
                        break;
                      case mov_r0_adr:
                        pIVar3 = (IMC_Generator *)
                                 &(c.
                                   super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->op1;
                        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_140,
                                     (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *
                                     )pIVar3);
                        operatorToString_abi_cxx11_
                                  (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_140);
                        std::operator+(&local_398,"MOV R0, ",&bStack_3b8);
                        std::__cxx11::string::append((string *)&out);
                        std::__cxx11::string::~string((string *)&local_398);
                        std::__cxx11::string::~string((string *)&bStack_3b8);
                        this_00 = &local_140._M_refcount;
                        break;
                      case mov_r1_adr:
                        pIVar3 = (IMC_Generator *)
                                 &(c.
                                   super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->op1;
                        std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_160,
                                     (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> *
                                     )pIVar3);
                        operatorToString_abi_cxx11_
                                  (&bStack_3b8,pIVar3,(shared_ptr<nigel::IM_Operator> *)&local_160);
                        std::operator+(&local_398,"MOV R1, ",&bStack_3b8);
                        std::__cxx11::string::append((string *)&out);
                        std::__cxx11::string::~string((string *)&local_398);
                        std::__cxx11::string::~string((string *)&bStack_3b8);
                        this_00 = &local_160._M_refcount;
                        break;
                      default:
                        if (HVar1 != dec_a) {
                          if (HVar1 == cpl_bit) {
                            pIVar3 = (IMC_Generator *)
                                     &(c.
                                       super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->op1;
                            std::__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr(&local_270,
                                         (__shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                          *)pIVar3);
                            operatorToString_abi_cxx11_
                                      (&bStack_3b8,pIVar3,
                                       (shared_ptr<nigel::IM_Operator> *)&local_270);
                            std::operator+(&local_398,"CPL ",&bStack_3b8);
                            std::__cxx11::string::append((string *)&out);
                            std::__cxx11::string::~string((string *)&local_398);
                            std::__cxx11::string::~string((string *)&bStack_3b8);
                            this_00 = &local_270._M_refcount;
                            break;
                          }
                          if (HVar1 != xch_a_atr0) goto switchD_0015d454_caseD_a5;
                        }
                        goto switchD_0015d6e4_caseD_e4;
                      }
                    }
                  }
                }
                goto LAB_0015e8a2;
              }
            }
            goto switchD_0015d6e4_caseD_e4;
          }
          goto LAB_0015e8a2;
        }
switchD_0015d6e4_caseD_e4:
        dVar5 = (double)std::__cxx11::string::append((char *)&out);
        goto switchD_0015d3cf_default;
      }
LAB_0015e8a2:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
      dVar5 = extraout_XMM0_Qa;
      break;
    case blockBegin:
      bVar2 = std::operator!=(&(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->symbol,"");
      if (bVar2) {
        std::operator+(&local_398,
                       &(c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->symbol,", ");
        std::__cxx11::string::append((string *)&out);
        std::__cxx11::string::~string((string *)&local_398);
      }
      std::__cxx11::to_string
                (&local_358,
                 (c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id);
      std::operator+(&bStack_3b8,"begin",&local_358);
      std::operator+(&local_398,&bStack_3b8,":");
      std::__cxx11::string::append((string *)&out);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&bStack_3b8);
      std::__cxx11::string::~string((string *)&local_358);
      dVar5 = (double)std::__cxx11::string::push_back((char)&tabs);
      break;
    case blockEnd:
      std::__cxx11::to_string
                (&local_358,
                 (c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id);
      std::operator+(&bStack_3b8,"end",&local_358);
      std::operator+(&local_398,&bStack_3b8,":");
      std::__cxx11::string::append((string *)&out);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&bStack_3b8);
      std::__cxx11::string::~string((string *)&local_358);
      dVar5 = (double)std::__cxx11::string::pop_back();
      break;
    case blockFinish:
      std::__cxx11::to_string
                (&local_358,
                 (c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id);
      std::operator+(&bStack_3b8,"finish",&local_358);
      std::operator+(&local_398,&bStack_3b8,":");
      std::__cxx11::string::append((string *)&out);
      goto LAB_0015d56e;
    case conditionEnd:
      std::__cxx11::to_string
                (&local_358,
                 (c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id);
      std::operator+(&bStack_3b8,"true",&local_358);
      std::operator+(&local_398,&bStack_3b8,":");
      std::__cxx11::string::append((string *)&out);
LAB_0015d56e:
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&bStack_3b8);
      dVar5 = (double)std::__cxx11::string::~string((string *)&local_358);
    }
switchD_0015d3cf_default:
    helper::log((helper *)&out,dVar5);
    std::__cxx11::string::~string((string *)&out);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super___shared_ptr<nigel::IM_Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  } while( true );
}

Assistant:

void IMC_Generator::printAssembly( CodeBase & base )
	{
		log( "__ASM__" );

		String tabs = "";

		for( auto c : base.imCommands )
		{//Print all commands
			String out = tabs;
			if( c->type == IM_Command::Type::operation )
			{
				if( c->operation == HexOp::nop )					out += "NOP";

				else if( c->operation == HexOp::clr_a )				out += "CLR A";
				else if( c->operation == HexOp::clr_c )				out += "CLR C";

				else if( c->operation == HexOp::mov_a_const )		out += "MOV A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_a_adr )			out += "MOV A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_a_r0 )			out += "MOV A, R0";
				else if( c->operation == HexOp::mov_a_atr0 )		out += "MOV A, @R0";
				else if( c->operation == HexOp::mov_a_atr1 )		out += "MOV A, @R1";
				else if( c->operation == HexOp::mov_adr_const )		out += "MOV " + operatorToString( c->op1 ) + ", " + operatorToString( c->op2 );
				else if( c->operation == HexOp::mov_adr_a )			out += "MOV " + operatorToString( c->op1 ) + ", A";
				else if( c->operation == HexOp::mov_adr_r0 )		out += "MOV " + operatorToString( c->op1 ) + ", R0";
				else if( c->operation == HexOp::mov_adr_atr0 )		out += "MOV " + operatorToString( c->op1 ) + ", @R0";
				else if( c->operation == HexOp::mov_adr_adr )		out += "MOV " + operatorToString( c->op1 ) + ", " + operatorToString( c->op2 ) + " ; r into l";
				else if( c->operation == HexOp::mov_r0_const )		out += "MOV R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r0_a )			out += "MOV R0, A";
				else if( c->operation == HexOp::mov_r0_adr )		out += "MOV R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r1_const )		out += "MOV R1, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r1_a )			out += "MOV R1, A";
				else if( c->operation == HexOp::mov_r1_adr )		out += "MOV R1, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_atr0_const )	out += "MOV @R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_atr0_a )		out += "MOV @R0, A";
				else if( c->operation == HexOp::mov_atr1_a )		out += "MOV @R1, A";
				else if( c->operation == HexOp::mov_atr0_adr )		out += "MOV @R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_dptr_const )	out += "MOV DPTR, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::movx_a_dptr )		out += "MOVX A, @DPTR";
				else if( c->operation == HexOp::movx_dptr_a )		out += "MOVX @DPTR, A";

				else if( c->operation == HexOp::push_adr )			out += "PUSH " + operatorToString( c->op1 );
				else if( c->operation == HexOp::pop_adr )			out += "POP " + operatorToString( c->op1 );

				else if( c->operation == HexOp::xch_a_r0 )			out += "XCH A, R0";
				else if( c->operation == HexOp::xch_r0_a )			out += "XCH R0, A";
				else if( c->operation == HexOp::xch_a_r1 )			out += "XCH A, R1";
				else if( c->operation == HexOp::xch_r1_a )			out += "XCH R1, A";
				else if( c->operation == HexOp::xch_a_atr0 )		out += "XCH A, @R0";
				else if( c->operation == HexOp::xch_atr0_a )		out += "XCH @R0, A";
				else if( c->operation == HexOp::xch_a_adr )			out += "XCH A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xch_adr_a )			out += "XCH " + operatorToString( c->op1 ) + ", A";

				else if( c->operation == HexOp::add_a_const )		out += "ADD A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::add_a_adr )			out += "ADD A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::add_a_r0 )			out += "ADD A, R0";
				else if( c->operation == HexOp::add_a_atr0 )		out += "ADD A, @R0";
				else if( c->operation == HexOp::sub_a_const )		out += "SUBB A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::sub_a_adr )			out += "SUBB A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::sub_a_r0 )			out += "SUBB A, R0";
				else if( c->operation == HexOp::sub_a_atr0 )		out += "SUBB A, @R0";
				else if( c->operation == HexOp::mul_a_b )			out += "MUL AB";
				else if( c->operation == HexOp::div_a_b )			out += "DIV AB";

				else if( c->operation == HexOp::inc_a )				out += "INC A";
				else if( c->operation == HexOp::dec_a )				out += "DEC A";
				else if( c->operation == HexOp::rr_a )				out += "RR A";
				else if( c->operation == HexOp::rl_a )				out += "RL A";

				else if( c->operation == HexOp::and_a_const )		out += "ANL A, #" + operatorToString( c->op1 );
				else if( c->operation == HexOp::and_a_adr )			out += "ANL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::and_a_atr0 )		out += "ANL A, @R0";
				else if( c->operation == HexOp::or_a_const )		out += "ORL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::or_a_adr )			out += "ORL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::or_a_atr0 )			out += "ORL A, @R0";
				else if( c->operation == HexOp::xor_a_const )		out += "XRL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xor_a_adr )			out += "XRL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xor_a_atr0 )		out += "XRL A, @R0";

				else if( c->operation == HexOp::cpl_a )				out += "CPL A";

				else if( c->operation == HexOp::cpl_bit )			out += "CPL " + operatorToString( c->op1 );
				else if( c->operation == HexOp::clr_bit )			out += "CLR " + operatorToString( c->op1 );
				else if( c->operation == HexOp::set_bit )			out += "SETB " + operatorToString( c->op1 );

				else if( c->operation == HexOp::jmp_abs )			out += "LJMP " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_rel )			out += "SJMP " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_c_rel )			out += "JC " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_nc_rel )		out += "JNC " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_z_rel )			out += "JZ " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_nz_rel )		out += "JNZ " + operatorToString( c->op1 );

				else if( c->operation == HexOp::call_abs )			out += "LCALL " + operatorToString( c->op1 );
				else if( c->operation == HexOp::ret )				out += "RET";
				else if( c->operation == HexOp::reti )				out += "RETI";

				else if( c->operation == HexOp::reti )				out += "-!-UNKNOWN_COMMAND-!-";
			}
			else if( c->type == IM_Command::Type::blockBegin )
			{
				if( c->symbol != "" ) out += c->symbol + ", ";
				out += "begin" + to_string( c->id ) + ":";
				tabs += '\t';
			}
			else if( c->type == IM_Command::Type::blockEnd )
			{
				out += "end" + to_string( c->id ) + ":";
				tabs.pop_back();
			}
			else if( c->type == IM_Command::Type::blockFinish )
			{
				out += "finish" + to_string( c->id ) + ":";
			}
			else if( c->type == IM_Command::Type::conditionEnd )
			{
				out += "true" + to_string( c->id ) + ":";
			}

			log( out );
		}

		log( "__END__" );
	}